

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O0

void __thiscall
QHeaderViewPrivate::sectionsMoved
          (QHeaderViewPrivate *this,QModelIndex *sourceParent,int logicalStart,int logicalEnd,
          QModelIndex *destinationParent,int logicalDestination)

{
  bool bVar1;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  QPersistentModelIndex *in_stack_ffffffffffffffa8;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = ::operator!=(in_RDI,in_stack_ffffffffffffffa8);
  if ((!bVar1) && (bVar1 = ::operator!=(in_RDI,in_stack_ffffffffffffffa8), !bVar1)) {
    memset(local_20,0,0x18);
    QList<QPersistentModelIndex>::QList((QList<QPersistentModelIndex> *)0x83403a);
    sectionsChanged((QHeaderViewPrivate *)sourceParent,
                    (QList<QPersistentModelIndex> *)CONCAT44(logicalStart,logicalEnd),
                    destinationParent._4_4_);
    QList<QPersistentModelIndex>::~QList((QList<QPersistentModelIndex> *)0x834055);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHeaderViewPrivate::sectionsMoved(const QModelIndex &sourceParent, int logicalStart,
                                       int logicalEnd, const QModelIndex &destinationParent,
                                       int logicalDestination)
{
    if (sourceParent != root || destinationParent != root)
        return; // we only handle changes in the root level
    Q_UNUSED(logicalStart);
    Q_UNUSED(logicalEnd);
    Q_UNUSED(logicalDestination);
    sectionsChanged();
}